

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_reflect.cpp
# Opt level: O2

void __thiscall spirv_cross::CompilerReflection::emit_entry_points(CompilerReflection *this)

{
  Stream *pSVar1;
  SpecializationConstant *pSVar2;
  size_t sVar3;
  SPIREntryPoint *pSVar4;
  WorkgroupSize *pWVar5;
  ExecutionModel model;
  uint32_t *puVar6;
  long lVar7;
  long lVar8;
  EntryPoint *__i;
  EntryPoint *pEVar9;
  EntryPoint *pEVar10;
  allocator local_1d9;
  SpecializationConstant spec_y;
  SpecializationConstant spec_z;
  SpecializationConstant spec_x;
  string local_1a8;
  SmallVector<spirv_cross::EntryPoint,_8UL> entries;
  
  Compiler::get_entry_points_and_stages(&entries,(Compiler *)this);
  sVar3 = entries.super_VectorView<spirv_cross::EntryPoint>.buffer_size;
  pEVar10 = entries.super_VectorView<spirv_cross::EntryPoint>.ptr;
  if (entries.super_VectorView<spirv_cross::EntryPoint>.buffer_size != 0) {
    lVar7 = entries.super_VectorView<spirv_cross::EntryPoint>.buffer_size * 0x28;
    pEVar9 = entries.super_VectorView<spirv_cross::EntryPoint>.ptr +
             entries.super_VectorView<spirv_cross::EntryPoint>.buffer_size;
    lVar8 = 0x3f;
    if (entries.super_VectorView<spirv_cross::EntryPoint>.buffer_size != 0) {
      for (; entries.super_VectorView<spirv_cross::EntryPoint>.buffer_size >> lVar8 == 0;
          lVar8 = lVar8 + -1) {
      }
    }
    ::std::
    __introsort_loop<spirv_cross::EntryPoint*,long,__gnu_cxx::__ops::_Iter_comp_iter<spirv_cross::CompilerReflection::emit_entry_points()::__0>>
              (entries.super_VectorView<spirv_cross::EntryPoint>.ptr,pEVar9,
               ((uint)lVar8 ^ 0x3f) * 2 ^ 0x7e);
    if ((long)sVar3 < 0x11) {
      ::std::
      __insertion_sort<spirv_cross::EntryPoint*,__gnu_cxx::__ops::_Iter_comp_iter<spirv_cross::CompilerReflection::emit_entry_points()::__0>>
                (pEVar10,pEVar9);
    }
    else {
      pEVar9 = pEVar10 + 0x10;
      ::std::
      __insertion_sort<spirv_cross::EntryPoint*,__gnu_cxx::__ops::_Iter_comp_iter<spirv_cross::CompilerReflection::emit_entry_points()::__0>>
                (pEVar10,pEVar9);
      for (lVar7 = lVar7 + -0x280; lVar7 != 0; lVar7 = lVar7 + -0x28) {
        ::std::
        __unguarded_linear_insert<spirv_cross::EntryPoint*,__gnu_cxx::__ops::_Val_comp_iter<spirv_cross::CompilerReflection::emit_entry_points()::__0>>
                  (pEVar9);
        pEVar9 = pEVar9 + 1;
      }
    }
    pSVar1 = (this->json_stream).super___shared_ptr<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    ::std::__cxx11::string::string((string *)&local_1a8,"entryPoints",(allocator *)&spec_x);
    simple_json::Stream::emit_json_key_array(pSVar1,&local_1a8);
    ::std::__cxx11::string::~string((string *)&local_1a8);
    pEVar10 = entries.super_VectorView<spirv_cross::EntryPoint>.ptr;
    for (lVar8 = entries.super_VectorView<spirv_cross::EntryPoint>.buffer_size * 0x28;
        pSVar1 = (this->json_stream).
                 super___shared_ptr<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
        lVar8 != 0; lVar8 = lVar8 + -0x28) {
      simple_json::Stream::begin_json_object(pSVar1);
      pSVar1 = (this->json_stream).
               super___shared_ptr<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      ::std::__cxx11::string::string((string *)&local_1a8,"name",(allocator *)&spec_x);
      simple_json::Stream::emit_json_key_value(pSVar1,&local_1a8,&pEVar10->name);
      ::std::__cxx11::string::~string((string *)&local_1a8);
      pSVar1 = (this->json_stream).
               super___shared_ptr<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      ::std::__cxx11::string::string((string *)&local_1a8,"mode",(allocator *)&spec_y);
      execution_model_to_str_abi_cxx11_
                ((string *)&spec_x,(CompilerReflection *)(ulong)pEVar10->execution_model,model);
      simple_json::Stream::emit_json_key_value(pSVar1,&local_1a8,(string *)&spec_x);
      ::std::__cxx11::string::~string((string *)&spec_x);
      ::std::__cxx11::string::~string((string *)&local_1a8);
      if (pEVar10->execution_model == ExecutionModelGLCompute) {
        pSVar4 = Compiler::get_entry_point((Compiler *)this,&pEVar10->name,ExecutionModelGLCompute);
        spec_x.id.id = 0;
        spec_y.id.id = 0;
        spec_z.id.id = 0;
        Compiler::get_work_group_size_specialization_constants
                  ((Compiler *)this,&spec_x,&spec_y,&spec_z);
        pSVar1 = (this->json_stream).
                 super___shared_ptr<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        ::std::__cxx11::string::string((string *)&local_1a8,"workgroup_size",&local_1d9);
        simple_json::Stream::emit_json_key_array(pSVar1,&local_1a8);
        ::std::__cxx11::string::~string((string *)&local_1a8);
        pWVar5 = &pSVar4->workgroup_size;
        if (spec_x.id.id != 0) {
          pWVar5 = (WorkgroupSize *)&spec_x.constant_id;
        }
        simple_json::Stream::emit_json_array_value
                  ((this->json_stream).
                   super___shared_ptr<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                   pWVar5->x);
        pSVar2 = (SpecializationConstant *)&pSVar4->workgroup_size;
        if (spec_y.id.id != 0) {
          pSVar2 = &spec_y;
        }
        simple_json::Stream::emit_json_array_value
                  ((this->json_stream).
                   super___shared_ptr<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                   pSVar2->constant_id);
        puVar6 = &(pSVar4->workgroup_size).z;
        if (spec_z.id.id != 0) {
          puVar6 = &spec_z.constant_id;
        }
        simple_json::Stream::emit_json_array_value
                  ((this->json_stream).
                   super___shared_ptr<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                   *puVar6);
        simple_json::Stream::end_json_array
                  ((this->json_stream).
                   super___shared_ptr<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
        pSVar1 = (this->json_stream).
                 super___shared_ptr<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        ::std::__cxx11::string::string
                  ((string *)&local_1a8,"workgroup_size_is_spec_constant_id",&local_1d9);
        simple_json::Stream::emit_json_key_array(pSVar1,&local_1a8);
        ::std::__cxx11::string::~string((string *)&local_1a8);
        simple_json::Stream::emit_json_array_value
                  ((this->json_stream).
                   super___shared_ptr<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                   spec_x.id.id != 0);
        simple_json::Stream::emit_json_array_value
                  ((this->json_stream).
                   super___shared_ptr<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                   spec_y.id.id != 0);
        simple_json::Stream::emit_json_array_value
                  ((this->json_stream).
                   super___shared_ptr<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                   spec_z.id.id != 0);
        simple_json::Stream::end_json_array
                  ((this->json_stream).
                   super___shared_ptr<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      }
      simple_json::Stream::end_json_object
                ((this->json_stream).
                 super___shared_ptr<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      pEVar10 = pEVar10 + 1;
    }
    simple_json::Stream::end_json_array(pSVar1);
  }
  SmallVector<spirv_cross::EntryPoint,_8UL>::~SmallVector(&entries);
  return;
}

Assistant:

void CompilerReflection::emit_entry_points()
{
	auto entries = get_entry_points_and_stages();
	if (!entries.empty())
	{
		// Needed to make output deterministic.
		sort(begin(entries), end(entries), [](const EntryPoint &a, const EntryPoint &b) -> bool {
			if (a.execution_model < b.execution_model)
				return true;
			else if (a.execution_model > b.execution_model)
				return false;
			else
				return a.name < b.name;
		});

		json_stream->emit_json_key_array("entryPoints");
		for (auto &e : entries)
		{
			json_stream->begin_json_object();
			json_stream->emit_json_key_value("name", e.name);
			json_stream->emit_json_key_value("mode", execution_model_to_str(e.execution_model));
			if (e.execution_model == ExecutionModelGLCompute)
			{
				const auto &spv_entry = get_entry_point(e.name, e.execution_model);

				SpecializationConstant spec_x, spec_y, spec_z;
				get_work_group_size_specialization_constants(spec_x, spec_y, spec_z);

				json_stream->emit_json_key_array("workgroup_size");
				json_stream->emit_json_array_value(spec_x.id != ID(0) ? spec_x.constant_id :
				                                                        spv_entry.workgroup_size.x);
				json_stream->emit_json_array_value(spec_y.id != ID(0) ? spec_y.constant_id :
				                                                        spv_entry.workgroup_size.y);
				json_stream->emit_json_array_value(spec_z.id != ID(0) ? spec_z.constant_id :
				                                                        spv_entry.workgroup_size.z);
				json_stream->end_json_array();

				json_stream->emit_json_key_array("workgroup_size_is_spec_constant_id");
				json_stream->emit_json_array_value(spec_x.id != ID(0));
				json_stream->emit_json_array_value(spec_y.id != ID(0));
				json_stream->emit_json_array_value(spec_z.id != ID(0));
				json_stream->end_json_array();
			}
			json_stream->end_json_object();
		}
		json_stream->end_json_array();
	}
}